

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

bool google::protobuf::compiler::ContainsParentReference(string *path)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  bVar1 = std::operator==(path,"..");
  bVar3 = true;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"../",&local_59);
    bVar1 = HasPrefixString(path,&local_38);
    bVar3 = true;
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"/..",&local_5a);
      bVar1 = HasSuffixString(path,&local_58);
      bVar3 = true;
      if (!bVar1) {
        lVar2 = std::__cxx11::string::find((char *)path,0x24e4eb);
        bVar3 = lVar2 != -1;
      }
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar3;
}

Assistant:

static inline bool ContainsParentReference(const string& path) {
  return path == ".." ||
         HasPrefixString(path, "../") ||
         HasSuffixString(path, "/..") ||
         path.find("/../") != string::npos;
}